

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendOperator(ScriptBuilder *this,ScriptType type)

{
  value_type local_15;
  ScriptType local_14;
  ScriptBuilder *pSStack_10;
  ScriptType type_local;
  ScriptBuilder *this_local;
  
  local_15 = (value_type)type;
  local_14 = type;
  pSStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->script_byte_array_,
             &local_15);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendOperator(ScriptType type) {
  script_byte_array_.push_back(type);
  return *this;
}